

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjoint_sets.cpp
# Opt level: O2

void __thiscall geometrycentral::DisjointSets::DisjointSets(DisjointSets *this,size_t n_)

{
  pointer puVar1;
  pointer puVar2;
  size_t i;
  ulong uVar3;
  allocator_type local_1a;
  allocator_type local_19;
  
  this->n = n_;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->parent,n_ + 1,&local_19)
  ;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->rank,this->n + 1,&local_1a);
  puVar1 = (this->rank).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->parent).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar3 = 0; uVar3 <= this->n; uVar3 = uVar3 + 1) {
    puVar1[uVar3] = 0;
    puVar2[uVar3] = uVar3;
  }
  return;
}

Assistant:

DisjointSets::DisjointSets(size_t n_) : n(n_), parent(n + 1), rank(n + 1) {
  // Initialize all elements to be in different sets and to have rank 0
  for (size_t i = 0; i <= n; i++) {
    rank[i] = 0;
    parent[i] = i;
  }
}